

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

void __thiscall cmCTestMemCheckHandler::Initialize(cmCTestMemCheckHandler *this)

{
  cmCTestMemCheckHandler *this_local;
  
  cmCTestTestHandler::Initialize(&this->super_cmCTestTestHandler);
  this->LogWithPID = false;
  (this->super_cmCTestTestHandler).CustomMaximumPassedTestOutputSize = 0;
  (this->super_cmCTestTestHandler).CustomMaximumFailedTestOutputSize = 0;
  std::__cxx11::string::clear();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->MemoryTesterDynamicOptions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->MemoryTesterOptions);
  this->MemoryTesterStyle = 0;
  std::__cxx11::string::clear();
  this->DefectCount = 0;
  return;
}

Assistant:

void cmCTestMemCheckHandler::Initialize()
{
  this->Superclass::Initialize();
  this->LogWithPID = false;
  this->CustomMaximumPassedTestOutputSize = 0;
  this->CustomMaximumFailedTestOutputSize = 0;
  this->MemoryTester.clear();
  this->MemoryTesterDynamicOptions.clear();
  this->MemoryTesterOptions.clear();
  this->MemoryTesterStyle = UNKNOWN;
  this->MemoryTesterOutputFile.clear();
  this->DefectCount = 0;
}